

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlReaderForDoc(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  char *val_00;
  char *val_01;
  xmlTextReaderPtr val_02;
  int local_4c;
  int n_options;
  int options;
  int n_encoding;
  char *encoding;
  int n_URL;
  char *URL;
  int n_cur;
  xmlChar *cur;
  xmlTextReaderPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (URL._4_4_ = 0; (int)URL._4_4_ < 5; URL._4_4_ = URL._4_4_ + 1) {
    for (encoding._4_4_ = 0; (int)encoding._4_4_ < 8; encoding._4_4_ = encoding._4_4_ + 1) {
      for (n_options = 0; n_options < 4; n_options = n_options + 1) {
        for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_const_xmlChar_ptr(URL._4_4_,0);
          val_00 = gen_filepath(encoding._4_4_,1);
          val_01 = gen_const_char_ptr(n_options,2);
          iVar2 = gen_parseroptions(local_4c,3);
          val_02 = (xmlTextReaderPtr)xmlReaderForDoc(val,val_00,val_01,iVar2);
          desret_xmlTextReaderPtr(val_02);
          call_tests = call_tests + 1;
          des_const_xmlChar_ptr(URL._4_4_,val,0);
          des_filepath(encoding._4_4_,val_00,1);
          des_const_char_ptr(n_options,val_01,2);
          des_parseroptions(local_4c,iVar2,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlReaderForDoc",(ulong)(uint)(iVar2 - iVar1));
            ret_val._4_4_ = ret_val._4_4_ + 1;
            printf(" %d",(ulong)URL._4_4_);
            printf(" %d",(ulong)encoding._4_4_);
            printf(" %d",(ulong)(uint)n_options);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlReaderForDoc(void) {
    int test_ret = 0;

#if defined(LIBXML_READER_ENABLED)
    int mem_base;
    xmlTextReaderPtr ret_val;
    xmlChar * cur; /* a pointer to a zero terminated string */
    int n_cur;
    const char * URL; /* the base URL to use for the document */
    int n_URL;
    char * encoding; /* the document encoding, or NULL */
    int n_encoding;
    int options; /* a combination of xmlParserOption */
    int n_options;

    for (n_cur = 0;n_cur < gen_nb_const_xmlChar_ptr;n_cur++) {
    for (n_URL = 0;n_URL < gen_nb_filepath;n_URL++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
    for (n_options = 0;n_options < gen_nb_parseroptions;n_options++) {
        mem_base = xmlMemBlocks();
        cur = gen_const_xmlChar_ptr(n_cur, 0);
        URL = gen_filepath(n_URL, 1);
        encoding = gen_const_char_ptr(n_encoding, 2);
        options = gen_parseroptions(n_options, 3);

        ret_val = xmlReaderForDoc((const xmlChar *)cur, URL, (const char *)encoding, options);
        desret_xmlTextReaderPtr(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_cur, (const xmlChar *)cur, 0);
        des_filepath(n_URL, URL, 1);
        des_const_char_ptr(n_encoding, (const char *)encoding, 2);
        des_parseroptions(n_options, options, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlReaderForDoc",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_cur);
            printf(" %d", n_URL);
            printf(" %d", n_encoding);
            printf(" %d", n_options);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}